

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::PipelineCache>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)15>_> obj;
  VkPipelineCache local_78;
  Deleter<vk::Handle<(vk::HandleType)15>_> DStack_70;
  void *local_58;
  Move<vk::Handle<(vk::HandleType)15>_> local_48;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  DStack_70.m_deviceIface = (DeviceInterface *)0x0;
  DStack_70.m_device = (VkDevice)0x0;
  DStack_70.m_allocator = (VkAllocationCallbacks *)0x0;
  local_58 = (void *)0x0;
  local_78.m_internal = 0x11;
  ::vk::createPipelineCache
            (&local_48,vk,device,(VkPipelineCacheCreateInfo *)&local_78,(VkAllocationCallbacks *)0x0
            );
  local_78.m_internal._4_4_ =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal._4_4_;
  local_78.m_internal._0_4_ =
       (undefined4)local_48.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.object.m_internal;
  DStack_70.m_deviceIface =
       (DeviceInterface *)
       CONCAT44(local_48.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_deviceIface
                ._4_4_,local_48.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
                       m_deviceIface._0_4_);
  DStack_70.m_device =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_device;
  DStack_70.m_allocator =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.m_allocator;
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)15>_>::operator()(&DStack_70,local_78);
  }
  local_78.m_internal = (deUint64)&DStack_70.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_78.m_internal,
             (undefined1 *)
             ((long)&(DStack_70.m_deviceIface)->_vptr_DeviceInterface + local_78.m_internal));
  if ((VkDevice *)local_78.m_internal != &DStack_70.m_device) {
    operator_delete((void *)local_78.m_internal,(ulong)(DStack_70.m_device + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}